

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O2

double Executor::exp(double __x)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  bool bVar4;
  undefined1 uVar5;
  treeNode *ptVar6;
  Var *pVVar7;
  void *extraout_RAX;
  void *extraout_RAX_00;
  long extraout_RAX_01;
  treeNode *in_RDI;
  string *this;
  float fVar8;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar9;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  float fVar10;
  float in_stack_ffffffffffffff4c;
  string op;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  if ((in_RDI->kind).stmtKind == doRpt) {
    std::__cxx11::string::string((string *)&local_50,(string *)&in_RDI->text);
    pVVar7 = getVar(&local_50);
    __x = (double)std::__cxx11::string::~string((string *)&local_50);
    switch(pVVar7->kind) {
    case Integer:
      ptVar6 = (treeNode *)operator_new(0x58);
      treeNode::treeNode(ptVar6,(pVVar7->value).integer);
      dVar9 = extraout_XMM0_Qa_00;
      break;
    case Decmical:
      ptVar6 = (treeNode *)operator_new(0x58);
      treeNode::treeNode(ptVar6,(pVVar7->value).decmical);
      dVar9 = extraout_XMM0_Qa_02;
      break;
    case Boolean:
      ptVar6 = (treeNode *)operator_new(0x58);
      treeNode::treeNode(ptVar6,(pVVar7->value).boolean);
      dVar9 = extraout_XMM0_Qa_01;
      break;
    case Text:
      ptVar6 = (treeNode *)operator_new(0x58);
      std::__cxx11::string::string((string *)&local_70,(string *)&pVVar7->text);
      treeNode::treeNode(ptVar6,&local_70);
      this = &local_70;
      goto LAB_0010ad1a;
    default:
      goto switchD_0010a716_default;
    }
  }
  else {
    if ((in_RDI->kind).stmtKind == ifStmt) {
      ptVar6 = (treeNode *)operator_new(0x58);
      treeNode::treeNode(ptVar6,in_RDI);
      return extraout_XMM0_Qa;
    }
switchD_0010a716_default:
    if ((in_RDI->child[0]->kind).stmtKind == Unknown) {
      dVar9 = exp(__x);
      *(byte *)(extraout_RAX_01 + 0x54) = *(byte *)(extraout_RAX_01 + 0x54) ^ 1;
      return dVar9;
    }
    exp(__x);
    dVar9 = (double)std::__cxx11::string::string((string *)&op,(string *)&in_RDI->child[1]->text);
    exp(dVar9);
    bVar4 = std::operator==(&op,"+");
    if (bVar4) {
      uVar1 = *(uint *)((long)extraout_RAX + 0x50);
      if (uVar1 == 3) {
        if (*(int *)((long)extraout_RAX_00 + 0x50) != 3) {
LAB_0010adb1:
          reportError((Error)in_stack_ffffffffffffff4c);
        }
        ptVar6 = (treeNode *)operator_new(0x58);
        std::operator+(&local_90,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)extraout_RAX + 0x30),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)extraout_RAX_00 + 0x30));
        treeNode::treeNode(ptVar6,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
      }
      else {
        if ((1 < uVar1) || (uVar2 = *(uint *)((long)extraout_RAX_00 + 0x50), 1 < uVar2))
        goto LAB_0010adb1;
        ptVar6 = (treeNode *)operator_new(0x58);
        if (uVar1 == 0) {
          fVar8 = (float)*(int *)((long)extraout_RAX + 0x54);
        }
        else {
          fVar8 = *(float *)((long)extraout_RAX + 0x54);
        }
        if (uVar2 == 0) {
          fVar10 = (float)*(int *)((long)extraout_RAX_00 + 0x54);
        }
        else {
          fVar10 = *(float *)((long)extraout_RAX_00 + 0x54);
        }
        treeNode::treeNode(ptVar6,fVar8 + fVar10);
      }
LAB_0010aced:
      std::__cxx11::string::~string((string *)((long)extraout_RAX + 0x30));
    }
    else {
      bVar4 = std::operator==(&op,"-");
      if (bVar4) {
        ptVar6 = (treeNode *)operator_new(0x58);
        if (*(int *)((long)extraout_RAX + 0x50) == 0) {
          fVar8 = (float)*(int *)((long)extraout_RAX + 0x54);
        }
        else {
          fVar8 = *(float *)((long)extraout_RAX + 0x54);
        }
        if (*(int *)((long)extraout_RAX_00 + 0x50) == 0) {
          fVar10 = (float)*(int *)((long)extraout_RAX_00 + 0x54);
        }
        else {
          fVar10 = *(float *)((long)extraout_RAX_00 + 0x54);
        }
        treeNode::treeNode(ptVar6,fVar8 - fVar10);
        goto LAB_0010aced;
      }
      bVar4 = std::operator==(&op,"*");
      if (bVar4) {
        ptVar6 = (treeNode *)operator_new(0x58);
        if (*(int *)((long)extraout_RAX + 0x50) == 0) {
          fVar8 = (float)*(int *)((long)extraout_RAX + 0x54);
        }
        else {
          fVar8 = *(float *)((long)extraout_RAX + 0x54);
        }
        if (*(int *)((long)extraout_RAX_00 + 0x50) == 0) {
          fVar10 = (float)*(int *)((long)extraout_RAX_00 + 0x54);
        }
        else {
          fVar10 = *(float *)((long)extraout_RAX_00 + 0x54);
        }
        treeNode::treeNode(ptVar6,fVar8 * fVar10);
        goto LAB_0010aced;
      }
      bVar4 = std::operator==(&op,"/");
      if (bVar4) {
        iVar3 = *(int *)((long)extraout_RAX_00 + 0x50);
        if (iVar3 == 0) {
          in_stack_ffffffffffffff4c = *(float *)((long)extraout_RAX_00 + 0x54);
          fVar8 = (float)(int)in_stack_ffffffffffffff4c;
        }
        else {
          fVar8 = *(float *)((long)extraout_RAX_00 + 0x54);
          in_stack_ffffffffffffff4c = fVar8;
        }
        if ((fVar8 == 0.0) && (!NAN(fVar8))) goto LAB_0010adb1;
        fVar8 = in_stack_ffffffffffffff4c;
        ptVar6 = (treeNode *)operator_new(0x58);
        if (*(int *)((long)extraout_RAX + 0x50) == 0) {
          fVar10 = (float)*(int *)((long)extraout_RAX + 0x54);
        }
        else {
          fVar10 = *(float *)((long)extraout_RAX + 0x54);
        }
        if (iVar3 == 0) {
          fVar8 = (float)(int)in_stack_ffffffffffffff4c;
        }
        treeNode::treeNode(ptVar6,fVar10 / fVar8);
        goto LAB_0010aced;
      }
      bVar4 = std::operator==(&op,"&&");
      if ((!bVar4) && (bVar4 = std::operator==(&op,"||"), !bVar4)) {
        if ((1 < *(uint *)((long)extraout_RAX + 0x50)) ||
           (1 < *(uint *)((long)extraout_RAX_00 + 0x50))) goto LAB_0010adb1;
        bVar4 = std::operator==(&op,">");
        if (bVar4) {
          ptVar6 = (treeNode *)operator_new(0x58);
          if (*(int *)((long)extraout_RAX + 0x50) == 0) {
            fVar8 = (float)*(int *)((long)extraout_RAX + 0x54);
          }
          else {
            fVar8 = *(float *)((long)extraout_RAX + 0x54);
          }
          if (*(int *)((long)extraout_RAX_00 + 0x50) == 0) {
            fVar10 = (float)*(int *)((long)extraout_RAX_00 + 0x54);
          }
          else {
            fVar10 = *(float *)((long)extraout_RAX_00 + 0x54);
          }
          treeNode::treeNode(ptVar6,fVar10 < fVar8);
        }
        else {
          bVar4 = std::operator==(&op,"<");
          if (bVar4) {
            ptVar6 = (treeNode *)operator_new(0x58);
            if (*(int *)((long)extraout_RAX + 0x50) == 0) {
              fVar8 = (float)*(int *)((long)extraout_RAX + 0x54);
            }
            else {
              fVar8 = *(float *)((long)extraout_RAX + 0x54);
            }
            if (*(int *)((long)extraout_RAX_00 + 0x50) == 0) {
              fVar10 = (float)*(int *)((long)extraout_RAX_00 + 0x54);
            }
            else {
              fVar10 = *(float *)((long)extraout_RAX_00 + 0x54);
            }
            treeNode::treeNode(ptVar6,fVar8 < fVar10);
          }
          else {
            bVar4 = std::operator==(&op,"==");
            if (bVar4) {
              ptVar6 = (treeNode *)operator_new(0x58);
              if (*(int *)((long)extraout_RAX + 0x50) == 0) {
                fVar8 = (float)*(int *)((long)extraout_RAX + 0x54);
              }
              else {
                fVar8 = *(float *)((long)extraout_RAX + 0x54);
              }
              if (*(int *)((long)extraout_RAX_00 + 0x50) == 0) {
                fVar10 = (float)*(int *)((long)extraout_RAX_00 + 0x54);
              }
              else {
                fVar10 = *(float *)((long)extraout_RAX_00 + 0x54);
              }
              treeNode::treeNode(ptVar6,(bool)(-(fVar8 == fVar10) & 1));
            }
            else {
              bVar4 = std::operator==(&op,"!=");
              if (bVar4) {
                ptVar6 = (treeNode *)operator_new(0x58);
                if (*(int *)((long)extraout_RAX + 0x50) == 0) {
                  fVar8 = (float)*(int *)((long)extraout_RAX + 0x54);
                }
                else {
                  fVar8 = *(float *)((long)extraout_RAX + 0x54);
                }
                if (*(int *)((long)extraout_RAX_00 + 0x50) == 0) {
                  fVar10 = (float)*(int *)((long)extraout_RAX_00 + 0x54);
                }
                else {
                  fVar10 = *(float *)((long)extraout_RAX_00 + 0x54);
                }
                treeNode::treeNode(ptVar6,(bool)(-(fVar8 != fVar10) & 1));
              }
              else {
                bVar4 = std::operator==(&op,"<=");
                if ((bVar4) || (bVar4 = std::operator==(&op,"=<"), bVar4)) {
                  ptVar6 = (treeNode *)operator_new(0x58);
                  if (*(int *)((long)extraout_RAX + 0x50) == 0) {
                    fVar8 = (float)*(int *)((long)extraout_RAX + 0x54);
                  }
                  else {
                    fVar8 = *(float *)((long)extraout_RAX + 0x54);
                  }
                  if (*(int *)((long)extraout_RAX_00 + 0x50) == 0) {
                    fVar10 = (float)*(int *)((long)extraout_RAX_00 + 0x54);
                  }
                  else {
                    fVar10 = *(float *)((long)extraout_RAX_00 + 0x54);
                  }
                  treeNode::treeNode(ptVar6,fVar8 <= fVar10);
                }
                else {
                  bVar4 = std::operator==(&op,">=");
                  if ((bVar4) || (bVar4 = std::operator==(&op,"=>"), bVar4)) {
                    ptVar6 = (treeNode *)operator_new(0x58);
                    if (*(int *)((long)extraout_RAX + 0x50) == 0) {
                      fVar8 = (float)*(int *)((long)extraout_RAX + 0x54);
                    }
                    else {
                      fVar8 = *(float *)((long)extraout_RAX + 0x54);
                    }
                    if (*(int *)((long)extraout_RAX_00 + 0x50) == 0) {
                      fVar10 = (float)*(int *)((long)extraout_RAX_00 + 0x54);
                    }
                    else {
                      fVar10 = *(float *)((long)extraout_RAX_00 + 0x54);
                    }
                    treeNode::treeNode(ptVar6,fVar10 <= fVar8);
                  }
                }
              }
            }
          }
        }
        goto LAB_0010aced;
      }
      if ((*(int *)((long)extraout_RAX_00 + 0x50) != 2) &&
         (*(int *)((long)extraout_RAX + 0x50) != 2)) goto LAB_0010adb1;
      bVar4 = std::operator==(&op,"&&");
      if (bVar4) {
        ptVar6 = (treeNode *)operator_new(0x58);
        if (*(char *)((long)extraout_RAX + 0x54) == '\x01') {
          uVar5 = *(undefined1 *)((long)extraout_RAX_00 + 0x54);
        }
        else {
          uVar5 = false;
        }
        treeNode::treeNode(ptVar6,(bool)uVar5);
        goto LAB_0010aced;
      }
      bVar4 = std::operator==(&op,"||");
      if (bVar4) {
        ptVar6 = (treeNode *)operator_new(0x58);
        uVar5 = true;
        if (*(char *)((long)extraout_RAX + 0x54) == '\0') {
          uVar5 = *(undefined1 *)((long)extraout_RAX_00 + 0x54);
        }
        treeNode::treeNode(ptVar6,(bool)uVar5);
        goto LAB_0010aced;
      }
      if (extraout_RAX != (void *)0x0) goto LAB_0010aced;
    }
    operator_delete(extraout_RAX);
    std::__cxx11::string::~string((string *)((long)extraout_RAX_00 + 0x30));
    operator_delete(extraout_RAX_00);
    this = &op;
LAB_0010ad1a:
    dVar9 = (double)std::__cxx11::string::~string((string *)this);
  }
  return dVar9;
}

Assistant:

treeNode* exp(treeNode* node)
    {
        treeNode* ret = nullptr;
        if(node->kind.expKind==ExpKind::constExp)return new treeNode(*node);
        if(node->kind.expKind==ExpKind::idExp)
        {
            auto retVar = getVar(node->text);
            switch(retVar->kind)
            {
                case AttrKind::Text:return new treeNode(retVar->text);
                case AttrKind::Integer:return new treeNode(retVar->value.integer);
                case AttrKind::Decmical:return new treeNode(retVar->value.decmical);
                case AttrKind::Boolean:return new treeNode(retVar->value.boolean);
            }
        }
        if(node->child[0]->kind.expKind==ExpKind::opExp)
        {
            ret = exp(node->child[1]);
            ret->attr.boolean=!ret->attr.boolean;
            return ret;
        }
        else 
        {
            auto left = exp(node->child[0]);
            string op = node->child[1]->text;
            auto right = exp(node->child[2]);
            if(op=="+")
            {
                if(left->attrKind==AttrKind::Text&&right->attrKind==AttrKind::Text)
                    ret = new treeNode(left->text + right->text);
                else if(checkDigit(left)&&checkDigit(right))
                    ret = new treeNode(GETDIGIT(left)+GETDIGIT(right));//string
                else
                    reportError(Error::errorType);
            } 
            else if(op=="-") ret = new treeNode(GETDIGIT(left)-GETDIGIT(right));
            else if(op=="*") ret = new treeNode(GETDIGIT(left)*GETDIGIT(right));
            else if(op=="/")
            {
                if(GETDIGIT(right)==0)
                    reportError(Error::divZero);
                else
                    ret = new treeNode(GETDIGIT(left)/GETDIGIT(right));
            }
            else if(op=="&&"||op=="||")
            {
                if(right->attrKind!=AttrKind::Boolean&&left->attrKind!=AttrKind::Boolean) 
                    reportError(Error::errorType);
                else if(op=="&&")ret = new treeNode(left->attr.boolean && right->attr.boolean);
                else if(op=="||")ret = new treeNode(left->attr.boolean || right->attr.boolean);
            }
            else
            {
                if(!(checkDigit(left)&&checkDigit(right)))reportError(Error::errorType);
                else if(op==">")ret = new treeNode(GETDIGIT(left)>GETDIGIT(right));
                else if(op=="<")ret = new treeNode(GETDIGIT(left)<GETDIGIT(right));
                else if(op=="==")ret = new treeNode(GETDIGIT(left)==GETDIGIT(right));
                else if(op=="!=")ret = new treeNode(GETDIGIT(left)!=GETDIGIT(right));
                else if(op=="<="||op=="=<")ret = new treeNode(GETDIGIT(left)<=GETDIGIT(right));
                else if(op==">="||op=="=>")ret = new treeNode(GETDIGIT(left)>=GETDIGIT(right));
            }
            delete left;
            delete right;
            return ret;
        }
    }